

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockUnlock(sqlite3_file *id,int eFileLock)

{
  int iVar1;
  int *piVar2;
  uint in_ESI;
  unixFile *in_RDI;
  int tErrno;
  int rc;
  char *zLockFile;
  unixFile *pFile;
  int local_2c;
  int local_4;
  
  if (in_RDI->eFileLock == in_ESI) {
    local_4 = 0;
  }
  else if (in_ESI == 1) {
    in_RDI->eFileLock = '\x01';
    local_4 = 0;
  }
  else {
    iVar1 = (*aSyscall[0x13].pCurrent)(in_RDI->lockingContext);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 2) {
        local_2c = 0;
      }
      else {
        local_2c = 0x80a;
        storeLastErrno(in_RDI,*piVar2);
      }
      local_4 = local_2c;
    }
    else {
      in_RDI->eFileLock = '\0';
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int dotlockUnlock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d pid=%d (dotlock)\n", pFile->h, eFileLock,
           pFile->eFileLock, osGetpid(0)));
  assert( eFileLock<=SHARED_LOCK );

  /* no-op if possible */
  if( pFile->eFileLock==eFileLock ){
    return SQLITE_OK;
  }

  /* To downgrade to shared, simply update our internal notion of the
  ** lock state.  No need to mess with the file on disk.
  */
  if( eFileLock==SHARED_LOCK ){
    pFile->eFileLock = SHARED_LOCK;
    return SQLITE_OK;
  }

  /* To fully unlock the database, delete the lock file */
  assert( eFileLock==NO_LOCK );
  rc = osRmdir(zLockFile);
  if( rc<0 ){
    int tErrno = errno;
    if( tErrno==ENOENT ){
      rc = SQLITE_OK;
    }else{
      rc = SQLITE_IOERR_UNLOCK;
      storeLastErrno(pFile, tErrno);
    }
    return rc;
  }
  pFile->eFileLock = NO_LOCK;
  return SQLITE_OK;
}